

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testProcrustes.cpp
# Opt level: O3

void testProcrustesWithMatrix<float>(M44d *m)

{
  ostream *poVar1;
  long lVar2;
  long lVar3;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  Rand48 random;
  vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_> toPoints;
  vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_> fromPoints;
  ushort local_13e [3];
  void *local_138;
  void *pvStack_130;
  long local_128;
  void *local_118;
  void *pvStack_110;
  long local_108;
  Vec3<float> local_100;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  undefined8 uStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  undefined1 local_48 [16];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing Procrustes algorithm with arbitrary matrix: \n",0x35);
  Imath_2_5::operator<<((ostream *)&std::cout,m);
  local_108 = 0;
  local_118 = (void *)0x0;
  pvStack_110 = (void *)0x0;
  local_128 = 0;
  local_138 = (void *)0x0;
  pvStack_130 = (void *)0x0;
  local_13e[0] = 0x7c67;
  local_13e[1] = 0x1005;
  local_13e[2] = 0x7c67;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   numPoints: ",0xe);
  lVar2 = 1;
  do {
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    std::ostream::flush();
    if (pvStack_110 != local_118) {
      pvStack_110 = local_118;
    }
    lVar3 = lVar2;
    if (pvStack_130 != local_138) {
      pvStack_130 = local_138;
    }
    do {
      dVar6 = Imath_2_5::erand48(local_13e);
      local_a8._8_4_ = extraout_XMM0_Dc;
      local_a8._0_8_ = dVar6;
      local_a8._12_4_ = extraout_XMM0_Dd;
      dVar6 = Imath_2_5::erand48(local_13e);
      local_b8._8_4_ = extraout_XMM0_Dc_00;
      local_b8._0_8_ = dVar6;
      local_b8._12_4_ = extraout_XMM0_Dd_00;
      dVar6 = Imath_2_5::erand48(local_13e);
      local_88 = m->x[0][0];
      dStack_80 = m->x[0][1];
      local_98 = m->x[1][0];
      dStack_90 = m->x[1][1];
      local_68 = m->x[2][0];
      dStack_60 = m->x[2][1];
      local_58 = m->x[3][0];
      dStack_50 = m->x[3][1];
      local_e0 = m->x[0][2];
      local_f0 = m->x[1][2];
      local_e8 = m->x[2][2];
      local_c0 = m->x[3][2];
      local_c8 = m->x[0][3];
      local_d8 = m->x[1][3];
      local_d0 = m->x[2][3];
      local_78 = m->x[3][3];
      uStack_70 = 0;
      local_100.x = (float)(double)local_a8._0_8_;
      local_100.y = (float)(double)local_b8._0_8_;
      local_48._8_4_ = extraout_XMM0_Dc_01;
      local_48._0_8_ = dVar6;
      local_48._12_4_ = extraout_XMM0_Dd_01;
      local_100.z = (float)dVar6;
      std::vector<Imath_2_5::Vec3<float>,std::allocator<Imath_2_5::Vec3<float>>>::
      emplace_back<Imath_2_5::Vec3<float>>
                ((vector<Imath_2_5::Vec3<float>,std::allocator<Imath_2_5::Vec3<float>>> *)&local_118
                 ,&local_100);
      dVar6 = local_78 +
              local_d0 * (double)local_48._0_8_ +
              local_c8 * (double)local_a8._0_8_ + local_d8 * (double)local_b8._0_8_;
      auVar4._0_8_ = local_58 +
                     (double)local_48._0_8_ * local_68 +
                     (double)local_a8._0_8_ * local_88 + (double)local_b8._0_8_ * local_98;
      auVar4._8_8_ = dStack_50 +
                     (double)local_48._0_8_ * dStack_60 +
                     (double)local_a8._0_8_ * dStack_80 + (double)local_b8._0_8_ * dStack_90;
      auVar5._8_8_ = dVar6;
      auVar5._0_8_ = dVar6;
      auVar5 = divpd(auVar4,auVar5);
      local_100.y = (float)auVar5._8_8_;
      local_100.x = (float)auVar5._0_8_;
      local_100.z = (float)((local_c0 +
                            local_e8 * (double)local_48._0_8_ +
                            local_e0 * (double)local_a8._0_8_ + local_f0 * (double)local_b8._0_8_) /
                           dVar6);
      std::vector<Imath_2_5::Vec3<float>,std::allocator<Imath_2_5::Vec3<float>>>::
      emplace_back<Imath_2_5::Vec3<float>>
                ((vector<Imath_2_5::Vec3<float>,std::allocator<Imath_2_5::Vec3<float>>> *)&local_138
                 ,&local_100);
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    verifyProcrustes<float>
              ((vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_> *)
               &local_118,
               (vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_> *)
               &local_138);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"OK\n",3);
  if (local_138 != (void *)0x0) {
    operator_delete(local_138,local_128 - (long)local_138);
  }
  if (local_118 != (void *)0x0) {
    operator_delete(local_118,local_108 - (long)local_118);
  }
  return;
}

Assistant:

void
testProcrustesWithMatrix (const IMATH_INTERNAL_NAMESPACE::M44d& m)
{
    std::cout << "Testing Procrustes algorithm with arbitrary matrix: \n" << m;
    std::vector<IMATH_INTERNAL_NAMESPACE::Vec3<T> > fromPoints;
    std::vector<IMATH_INTERNAL_NAMESPACE::Vec3<T> > toPoints;

    IMATH_INTERNAL_NAMESPACE::Rand48 random (1209);
    std::cout << "   numPoints: ";
    for (size_t numPoints = 1; numPoints < 10; ++numPoints)
    {
        std::cout << numPoints << " " << std::flush;
        fromPoints.clear(); toPoints.clear();
        for (size_t i = 0; i < numPoints; ++i)
        {
            const IMATH_INTERNAL_NAMESPACE::V3d fromPt (random.nextf(), random.nextf(), random.nextf());
            const IMATH_INTERNAL_NAMESPACE::V3d toPt = fromPt * m;
            fromPoints.push_back (IMATH_INTERNAL_NAMESPACE::Vec3<T>(fromPt));
            toPoints.push_back (IMATH_INTERNAL_NAMESPACE::Vec3<T>(toPt));
        }
        verifyProcrustes (fromPoints, toPoints);
    }
    std::cout << "OK\n";
}